

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guardedTests.cpp
# Opt level: O0

void __thiscall guarded_guarded_2_Test::TestBody(guarded_guarded_2_Test *this)

{
  bool bVar1;
  int *lhs;
  char *message;
  AssertHelper local_b8;
  Message local_b0;
  int local_a4;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar;
  handle data_handle;
  type local_68;
  thread local_60;
  thread th2;
  thread local_50;
  thread th1;
  undefined1 local_40 [8];
  guarded<int,_std::mutex> data;
  guarded_guarded_2_Test *this_local;
  
  th1._M_id._M_thread._4_4_ = 0;
  data.m_mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)this;
  gmlc::libguarded::guarded<int,_std::mutex>::guarded<int>
            ((guarded<int,_std::mutex> *)local_40,(int *)((long)&th1._M_id._M_thread + 4));
  th2._M_id._M_thread = (id)(id)local_40;
  std::thread::thread<guarded_guarded_2_Test::TestBody()::__0,,void>(&local_50,(type *)&th2);
  local_68.data = (guarded<int,_std::mutex> *)local_40;
  std::thread::thread<guarded_guarded_2_Test::TestBody()::__1,,void>(&local_60,&local_68);
  std::thread::join();
  std::thread::join();
  gmlc::libguarded::guarded<int,_std::mutex>::lock
            ((handle *)&gtest_ar.message_,(guarded<int,_std::mutex> *)local_40);
  lhs = gmlc::libguarded::lock_handle<int,_std::mutex>::operator*
                  ((lock_handle<int,_std::mutex> *)&gtest_ar.message_);
  local_a4 = 20000;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_a0,"*data_handle","20000",lhs,&local_a4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/guardedTests.cpp"
               ,0x6d,message);
    testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  gmlc::libguarded::lock_handle<int,_std::mutex>::~lock_handle
            ((lock_handle<int,_std::mutex> *)&gtest_ar.message_);
  std::thread::~thread(&local_60);
  std::thread::~thread(&local_50);
  return;
}

Assistant:

TEST(guarded, guarded_2)
{
    guarded<int> data(0);

    std::thread th1([&data]() {
        for (int i = 0; i < 10000; ++i) {
            auto data_handle = data.lock();
            ++(*data_handle);
        }
    });

    std::thread th2([&data]() {
        for (int i = 0; i < 10000; ++i) {
            auto data_handle = data.lock();
            ++(*data_handle);
        }
    });

    th1.join();
    th2.join();

    auto data_handle = data.lock();

    EXPECT_EQ(*data_handle, 20000);
}